

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_string.cc
# Opt level: O0

void __thiscall
ctemplate::StaticTemplateStringInitializer::StaticTemplateStringInitializer
          (StaticTemplateStringInitializer *this,StaticTemplateString *sts)

{
  TemplateId TVar1;
  undefined1 local_58 [8];
  TemplateString ts_copy_of_sts;
  StaticTemplateString *sts_local;
  StaticTemplateStringInitializer *this_local;
  
  if ((sts->do_not_use_directly_).id_ == 0) {
    TemplateString::TemplateString((TemplateString *)&ts_copy_of_sts.id_,sts);
    TVar1 = TemplateString::GetGlobalId((TemplateString *)&ts_copy_of_sts.id_);
    (sts->do_not_use_directly_).id_ = TVar1;
  }
  TemplateString::TemplateString((TemplateString *)local_58,sts);
  TemplateString::AddToGlobalIdToNameMap((TemplateString *)local_58);
  return;
}

Assistant:

StaticTemplateStringInitializer::StaticTemplateStringInitializer(
    const StaticTemplateString* sts) {
  // Compute the sts's id if it wasn't specified at static-init
  // time.  If it was specified at static-init time, verify it's
  // correct.  This is necessary because static-init id's are, by
  // nature, pre-computed, and the id-generating algorithm may have
  // changed between the time they were computed and now.
  if (sts->do_not_use_directly_.id_ == 0) {
    sts->do_not_use_directly_.id_ = TemplateString(*sts).GetGlobalId();
  } else {
    // Don't use the TemplateString(const StaticTemplateString& sts)
    // constructor below, since if we do, GetGlobalId will just return
    // sts->do_not_use_directly_.id_ and the check will be pointless.
    DCHECK_EQ(TemplateString(sts->do_not_use_directly_.ptr_,
                             sts->do_not_use_directly_.length_).GetGlobalId(),
              sts->do_not_use_directly_.id_);
  }

  // Now add this id/name pair to the backwards map from id to name.
  TemplateString ts_copy_of_sts(*sts);
  ts_copy_of_sts.AddToGlobalIdToNameMap();
}